

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_resize_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,void *dst,
          rf_int dst_size,rf_allocator temp_allocator)

{
  long lVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_image image_00;
  undefined1 auVar4 [16];
  rf_allocator_args rVar5;
  undefined1 auVar6 [24];
  int iVar7;
  int iVar8;
  rf_color *dst_00;
  long *in_FS_OFFSET;
  undefined8 uVar9;
  uint uStack_e4;
  undefined4 uStack_ac;
  _Bool format_success;
  uint uStack_64;
  rf_color *pixels;
  int pixels_size;
  int stb_format;
  rf_int dst_size_local;
  void *dst_local;
  int new_height_local;
  int new_width_local;
  
  if ((((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) ||
     (iVar7 = rf_bytes_per_pixel(image.format), dst_size < new_width * new_height * iVar7)) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    iVar7 = rf_format_to_stb_channel_count(image.format);
    if (iVar7 == 0) {
      iVar7 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
      iVar7 = image.width * image.height * iVar7;
      uVar9 = 0;
      rVar2.proc_name._0_4_ = 0x1b293e;
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.proc_name._4_4_ = 0;
      rVar2.line_in_file._0_4_ = 0x3e05;
      rVar2.line_in_file._4_4_ = 0;
      auVar6._8_8_ = (ulong)uStack_64 << 0x20;
      auVar6._0_8_ = (long)iVar7;
      auVar6._16_8_ = 0;
      dst_00 = (rf_color *)
               (*temp_allocator.allocator_proc)
                         (&temp_allocator,rVar2,RF_AM_ALLOC,(rf_allocator_args)(auVar6 << 0x40));
      if (dst_00 == (rf_color *)0x0) {
        rf_log_impl(8,0x1b25a7,(char *)0x2,(long)(image.width * image.height) << 2);
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_image_resize_to_buffer";
        *(undefined8 *)(lVar1 + -0x450) = 0x3e19;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_ac,2);
      }
      else {
        auVar4 = image._8_16_;
        image_00.format = (int)uVar9;
        image_00.valid = (_Bool)(char)((ulong)uVar9 >> 0x20);
        image_00._21_3_ = (int3)((ulong)uVar9 >> 0x28);
        image_00.data = (void *)auVar4._0_8_;
        image_00.width = auVar4._8_4_;
        image_00.height = auVar4._12_4_;
        iVar8 = rf_image_size(image_00);
        rf_format_pixels_to_rgba32((void *)image._0_20_,(long)iVar8,image.format,dst_00,(long)iVar7)
        ;
        lVar1 = *in_FS_OFFSET;
        *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
        *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
        stbir_resize_uint8((uchar *)dst_00,image.width,image.height,0,(uchar *)dst,new_width,
                           new_height,0,4);
        lVar1 = *in_FS_OFFSET;
        *(undefined8 *)(lVar1 + -0x440) = 0;
        *(undefined8 *)(lVar1 + -0x438) = 0;
        rf_format_pixels(dst_00,(long)iVar7,RF_UNCOMPRESSED_R8G8B8A8,dst,dst_size,image.format);
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->width = new_width;
        __return_storage_ptr__->height = new_height;
        __return_storage_ptr__->format = image.format;
        __return_storage_ptr__->valid = true;
      }
      rVar3.proc_name._0_4_ = 0x1b293e;
      rVar3.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar3.proc_name._4_4_ = 0;
      rVar3.line_in_file._0_4_ = 0x3e1b;
      rVar3.line_in_file._4_4_ = 0;
      rVar5.size_to_allocate_or_reallocate = 0;
      rVar5.pointer_to_free_or_realloc = dst_00;
      rVar5._16_8_ = (ulong)uStack_e4 << 0x20;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar3,RF_AM_FREE,rVar5);
    }
    else {
      lVar1 = *in_FS_OFFSET;
      *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
      *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
      stbir_resize_uint8((uchar *)image._0_20_,image.width,image.height,0,(uchar *)dst,new_width,
                         new_height,0,iVar7);
      lVar1 = *in_FS_OFFSET;
      *(undefined8 *)(lVar1 + -0x440) = 0;
      *(undefined8 *)(lVar1 + -0x438) = 0;
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = new_width;
      __return_storage_ptr__->height = new_height;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_to_buffer(rf_image image, int new_width, int new_height, void* dst, rf_int dst_size, rf_allocator temp_allocator)
{
    if (!image.valid || dst_size < new_width * new_height * rf_bytes_per_pixel(image.format)) return (rf_image){0};

    rf_image result = {0};

    int stb_format = rf_format_to_stb_channel_count(image.format);

    if (stb_format)
    {
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
        stbir_resize_uint8((unsigned char*) image.data, image.width, image.height, 0, (unsigned char*) dst, new_width, new_height, 0, stb_format);
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

        result.data   = dst;
        result.width  = new_width;
        result.height = new_height;
        result.format = image.format;
        result.valid  = true;
    }
    else // if the format of the image is not supported by stbir
    {
        int pixels_size = image.width * image.height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
        rf_color* pixels = RF_ALLOC(temp_allocator, pixels_size);

        if (pixels)
        {
            bool format_success = rf_format_pixels_to_rgba32(image.data, rf_image_size(image), image.format, pixels, pixels_size);
            RF_ASSERT(format_success);

            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
            stbir_resize_uint8((unsigned char*)pixels, image.width, image.height, 0, (unsigned char*) dst, new_width, new_height, 0, 4);
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            format_success = rf_format_pixels(pixels, pixels_size, RF_UNCOMPRESSED_R8G8B8A8, dst, dst_size, image.format);
            RF_ASSERT(format_success);

            result.data   = dst;
            result.width  = new_width;
            result.height = new_height;
            result.format = image.format;
            result.valid  = true;
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", image.width * image.height * sizeof(rf_color));

        RF_FREE(temp_allocator, pixels);
    }

    return result;
}